

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O3

void crnlib::utils::endian_switch_dwords(uint32 *p,uint num)

{
  uint uVar1;
  long lVar2;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      uVar1 = *(uint *)((long)p + lVar2);
      *(uint *)((long)p + lVar2) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar2 = lVar2 + 4;
    } while ((ulong)num << 2 != lVar2);
  }
  return;
}

Assistant:

void endian_switch_dwords(uint32* p, uint num)
        {
            uint32* p_end = p + num;
            while (p != p_end)
            {
                uint32 k = *p;
                *p++ = swap32(k);
            }
        }